

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::SetPartitionedByInfo::Deserialize(SetPartitionedByInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_> this_00;
  pointer pSVar1;
  __uniq_ptr_impl<duckdb::SetPartitionedByInfo,_std::default_delete<duckdb::SetPartitionedByInfo>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
  .super__Head_base<0UL,_duckdb::SetPartitionedByInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
        )operator_new(0x90);
  SetPartitionedByInfo
            ((SetPartitionedByInfo *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
             .super__Head_base<0UL,_duckdb::SetPartitionedByInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
  .super__Head_base<0UL,_duckdb::SetPartitionedByInfo_*,_false>._M_head_impl =
       (tuple<duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>)
       (tuple<duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
       .super__Head_base<0UL,_duckdb::SetPartitionedByInfo_*,_false>._M_head_impl;
  pSVar1 = unique_ptr<duckdb::SetPartitionedByInfo,_std::default_delete<duckdb::SetPartitionedByInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetPartitionedByInfo,_std::default_delete<duckdb::SetPartitionedByInfo>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,400,"partition_keys",&pSVar1->partition_keys);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::SetPartitionedByInfo_*,_std::default_delete<duckdb::SetPartitionedByInfo>_>
       .super__Head_base<0UL,_duckdb::SetPartitionedByInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> SetPartitionedByInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetPartitionedByInfo>(new SetPartitionedByInfo());
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(400, "partition_keys", result->partition_keys);
	return std::move(result);
}